

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O2

int state_align_search_step(ps_search_t *search,int frame_idx)

{
  acmod_t *acmod;
  char *pcVar1;
  ps_searchfuncs_t *ppVar2;
  int iVar3;
  int32 iVar4;
  int iVar5;
  _func_int_ps_search_t_ptr *p_Var6;
  dict2pid_t *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int i;
  long lVar11;
  int iVar12;
  long lVar13;
  int frame_idx_local;
  
  acmod = search->acmod;
  lVar13 = 0;
  frame_idx_local = frame_idx;
  for (lVar11 = 0; lVar11 < *(int *)&search[1].acmod; lVar11 = lVar11 + 1) {
    if (*(int *)(search[1].name + lVar13 + 0x4c) == frame_idx) {
      acmod_activate_hmm(acmod,(hmm_t *)(search[1].name + lVar13));
    }
    lVar13 = lVar13 + 0x58;
  }
  p_Var6 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,&frame_idx_local);
  if (*(int *)&search[1].dict < -0x1fd00000) {
    lVar13 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xc1,"Renormalizing Scores at frame %d, best score %d\n",(ulong)(uint)frame_idx_local);
    iVar4 = *(int32 *)&search[1].dict;
    for (lVar11 = 0; lVar11 < *(int *)&search[1].acmod; lVar11 = lVar11 + 1) {
      hmm_normalize((hmm_t *)(search[1].name + lVar13),iVar4);
      lVar13 = lVar13 + 0x58;
    }
  }
  iVar10 = frame_idx_local;
  (search[1].vt)->finish = p_Var6;
  iVar12 = -0x20000000;
  lVar13 = 0;
  lVar11 = 0;
  while( true ) {
    iVar3 = frame_idx_local;
    iVar5 = *(int *)&search[1].acmod;
    lVar8 = (long)iVar5;
    if (lVar8 <= lVar11) break;
    if (iVar10 <= *(int *)(search[1].name + lVar13 + 0x4c)) {
      iVar4 = hmm_vit_eval((hmm_t *)(search[1].name + lVar13));
      if (iVar12 < iVar4) {
        iVar12 = iVar4;
      }
    }
    lVar11 = lVar11 + 1;
    lVar13 = lVar13 + 0x58;
  }
  *(int *)&search[1].dict = iVar12;
  lVar11 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar11;
  }
  lVar13 = 0x4c;
  for (; lVar8 != lVar11; lVar11 = lVar11 + 1) {
    if ((frame_idx_local <= *(int *)(search[1].name + lVar13)) &&
       (frame_idx_local < (&(search[1].config)->refcount)[lVar11])) {
      *(int *)(search[1].name + lVar13) = frame_idx_local + 1;
    }
    lVar13 = lVar13 + 0x58;
  }
  iVar10 = frame_idx_local + 1;
  lVar11 = 0x58;
  for (lVar13 = 0; iVar12 = frame_idx_local, lVar13 < iVar5 + -1; lVar13 = lVar13 + 1) {
    pcVar1 = search[1].name;
    if (((*(int *)(pcVar1 + lVar11 + -0xc) == iVar10) &&
        (*(int *)((long)&(search[1].pls)->vt + lVar13 * 4 + 4) <= iVar10)) &&
       ((*(int *)(pcVar1 + lVar11 + 0x4c) < iVar3 ||
        (*(int *)(pcVar1 + lVar11 + 8) < *(int32 *)(pcVar1 + lVar11 + -0x28))))) {
      hmm_enter((hmm_t *)(pcVar1 + lVar11),*(int32 *)(pcVar1 + lVar11 + -0x28),
                *(int32 *)(pcVar1 + lVar11 + -0x24),iVar10);
      iVar5 = *(int *)&search[1].acmod;
    }
    lVar11 = lVar11 + 0x58;
  }
  lVar11 = (long)frame_idx_local;
  if (frame_idx_local < *(int *)&search[1].hyp_str) {
    pdVar7 = search[1].d2p;
  }
  else {
    *(int *)&search[1].hyp_str = (int)(lVar11 + 0x15);
    pdVar7 = (dict2pid_t *)
             __ckd_realloc__(search[1].d2p,
                             (long)*(int *)((long)&search[1].dict + 4) * (lVar11 + 0x15) * 8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                             ,0x8d);
    search[1].d2p = pdVar7;
  }
  lVar13 = (long)*(int *)((long)&search[1].dict + 4);
  memset(&pdVar7->refcount + lVar13 * lVar11 * 2,0xff,lVar13 << 3);
  lVar11 = *(int *)((long)&search[1].dict + 4) * lVar11;
  pdVar7 = search[1].d2p;
  lVar13 = 0x1c;
  for (lVar8 = 0; lVar8 < *(int *)&search[1].acmod; lVar8 = lVar8 + 1) {
    pcVar1 = search[1].name;
    if (iVar12 <= *(int *)(pcVar1 + lVar8 * 0x58 + 0x4c)) {
      ppVar2 = search[1].vt;
      for (lVar9 = 0; iVar10 = *(int *)&ppVar2->start, lVar9 < iVar10; lVar9 = lVar9 + 1) {
        iVar10 = iVar10 * (int)lVar8 + (int)lVar9;
        (&pdVar7->refcount)[lVar11 * 2 + (long)iVar10 * 2] = *(int *)(pcVar1 + lVar9 * 4 + lVar13);
        *(undefined4 *)(&pdVar7->field_0x4 + (long)iVar10 * 8 + lVar11 * 8) =
             *(undefined4 *)(pcVar1 + lVar9 * 4 + lVar13 + -0x14);
        *(int *)(pcVar1 + lVar9 * 4 + lVar13) = iVar10;
      }
    }
    lVar13 = lVar13 + 0x58;
  }
  *(int *)((long)&search[1].acmod + 4) = frame_idx_local;
  return 0;
}

Assistant:

static int
state_align_search_step(ps_search_t *search, int frame_idx)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    acmod_t *acmod = ps_search_acmod(search);
    int16 const *senscr;
    int i;

    /* Calculate senone scores. */
    for (i = 0; i < sas->n_phones; ++i)
        if (hmm_frame(&sas->hmms[i]) == frame_idx)
            acmod_activate_hmm(acmod, &sas->hmms[i]);
    senscr = acmod_score(acmod, &frame_idx);

    /* Renormalize here if needed. */
    /* FIXME: Make sure to (unit-)test this!!! */
    if ((sas->best_score - 0x300000) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, sas->best_score);
        renormalize_hmms(sas, frame_idx, sas->best_score);
    }

    /* Viterbi step. */
    sas->best_score = evaluate_hmms(sas, senscr, frame_idx);
    prune_hmms(sas, frame_idx);

    /* Transition out of non-emitting states. */
    phone_transition(sas, frame_idx);

    /* Generate new tokens from best path results. */
    record_transitions(sas, frame_idx);

    /* Update frame counter */
    sas->frame = frame_idx;

    return 0;
}